

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<double>::Resize
          (RepeatedField<double> *this,int new_size,double *value)

{
  double dVar1;
  LogMessage *other;
  double *pdVar2;
  double *pdVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (new_size < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x275);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (new_size) >= (0): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    pdVar2 = elements(this);
    pdVar2 = pdVar2 + this->current_size_;
    pdVar3 = elements(this);
    if (pdVar2 != pdVar3 + new_size) {
      dVar1 = *value;
      do {
        *pdVar2 = dVar1;
        pdVar2 = pdVar2 + 1;
      } while (pdVar2 != pdVar3 + new_size);
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}